

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::injectBuffersForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  _Rb_tree_color _Var1;
  uint uVar2;
  pointer pcVar3;
  ulong __new_size;
  pthread_mutex_t *__mutex;
  int iVar4;
  cl_int cVar5;
  cl_platform_id p_Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  mapped_type *__k;
  iterator iVar11;
  long *plVar12;
  ulong uVar13;
  mapped_type_conflict *pmVar14;
  _Rb_tree_header *p_Var15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  void *pvVar18;
  undefined8 uVar19;
  mapped_type *pmVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar22;
  float __x;
  float __x_00;
  float __x_01;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar23;
  void *allocation;
  cl_int error;
  cl_mem memobj;
  string prefix;
  vector<char,_std::allocator<char>_> transferBuf;
  string fileName;
  cl_context context;
  char tmpStr [256];
  _Base_ptr local_478;
  pthread_mutex_t *local_470;
  string local_468;
  cl_command_queue local_448;
  _Rb_tree_header *local_440;
  _Rb_tree_header *local_438;
  _Rb_tree_header *local_430;
  _Rb_tree_header *local_428;
  _Base_ptr local_420;
  string local_418;
  vector<char,_std::allocator<char>_> local_3f8;
  CLdispatchXMap *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d0;
  CBufferInfoMap *local_3c8;
  CSVMAllocInfoMap *local_3c0;
  CUSMAllocInfoMap *local_3b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_3b0;
  CKernelInfoMap *local_3a8;
  CMemAllocNumberMap *local_3a0;
  cl_platform_id local_398;
  uint64_t local_390;
  _Rb_tree_node_base *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [32];
  int aiStack_320 [122];
  allocator local_138 [264];
  
  local_448 = command_queue;
  local_3d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)kernel;
  local_390 = enqueueCounter;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar4 != 0) {
    uVar19 = std::__throw_system_error(iVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p);
    }
    if (local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock(local_470);
    _Unwind_Resume(uVar19);
  }
  local_340._0_8_ = (cl_context)0x0;
  (*(this->m_Dispatch).clGetKernelInfo)(kernel,0x1193,8,local_340,(size_t *)0x0);
  p_Var6 = getPlatform(this,(cl_context)local_340._0_8_);
  local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_340,sc_DumpDirectoryName,local_138);
  OS::Services_Common::GetDumpDirectoryNameWithoutPid
            (&(this->m_OS).super_Services_Common,(string *)local_340,&local_418);
  if ((cl_context)local_340._0_8_ != (cl_context)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_);
  }
  std::__cxx11::string::append((char *)&local_418);
  local_470 = (pthread_mutex_t *)&this->m_Mutex;
  local_398 = p_Var6;
  pmVar7 = std::
           map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
           ::operator[](&this->m_KernelArgMemMap,(key_type *)&local_3d0);
  p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var15) {
    local_3b8 = &this->m_USMAllocInfoMap;
    local_428 = &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
    local_430 = &(this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header;
    local_438 = &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    local_3a0 = &this->m_MemAllocNumberMap;
    local_3a8 = &this->m_KernelInfoMap;
    local_3b0 = &(this->m_LongKernelNameMap)._M_h;
    local_3d8 = &this->m_DispatchX;
    local_440 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    local_3c0 = &this->m_SVMAllocInfoMap;
    local_3c8 = &this->m_BufferInfoMap;
    local_388 = &p_Var15->_M_header;
    do {
      _Var1 = p_Var8[1]._M_color;
      p_Var17 = p_Var8[1]._M_parent;
      local_478 = p_Var17;
      local_420 = p_Var17;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      p_Var9 = (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var15 = local_428;
      if (p_Var9 == (_Base_ptr)0x0) {
LAB_00180459:
        p_Var9 = (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = local_430;
        if (p_Var9 != (_Base_ptr)0x0) {
          do {
            if (*(_Base_ptr *)(p_Var9 + 1) >= p_Var17) {
              p_Var15 = (_Rb_tree_header *)p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(_Base_ptr *)(p_Var9 + 1) < p_Var17];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var15 != local_430) && ((_Base_ptr)p_Var15->_M_node_count <= p_Var17))
          goto LAB_001804d1;
        }
        p_Var9 = (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = local_438;
        if (p_Var9 != (_Base_ptr)0x0) {
          do {
            if (*(_Base_ptr *)(p_Var9 + 1) >= p_Var17) {
              p_Var15 = (_Rb_tree_header *)p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(_Base_ptr *)(p_Var9 + 1) < p_Var17];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var15 != local_438) && ((_Base_ptr)p_Var15->_M_node_count <= p_Var17))
          goto LAB_001804d1;
        }
      }
      else {
        do {
          if (*(_Base_ptr *)(p_Var9 + 1) >= p_Var17) {
            p_Var15 = (_Rb_tree_header *)p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(_Base_ptr *)(p_Var9 + 1) < p_Var17];
        } while (p_Var9 != (_Base_ptr)0x0);
        if ((p_Var15 == local_428) || (p_Var17 < (_Base_ptr)p_Var15->_M_node_count))
        goto LAB_00180459;
LAB_001804d1:
        local_340._0_8_ = p_Var17;
        pmVar10 = std::
                  map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                  ::operator[](local_3a0,(key_type *)local_340);
        uVar2 = *pmVar10;
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,local_418._M_dataplus._M_p,
                   local_418._M_dataplus._M_p + local_418._M_string_length);
        snprintf((char *)local_138,0x100,"%04u",local_390);
        std::__cxx11::string::append((char *)&local_380);
        std::__cxx11::string::append((char *)&local_380);
        std::__cxx11::string::append((char *)&local_380);
        local_468._M_dataplus._M_p = (pointer)local_3d0;
        __k = std::
              map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
              ::operator[](local_3a8,(key_type *)&local_468);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(local_3b0,&__k->KernelName);
        pmVar20 = (mapped_type *)
                  ((long)iVar11.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         ._M_cur + 0x28);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pmVar20 = __k;
        }
        local_340._0_8_ = local_340 + 0x10;
        pcVar3 = (pmVar20->KernelName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_340,pcVar3,pcVar3 + (pmVar20->KernelName)._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_380,local_340._0_8_);
        p_Var6 = local_398;
        if ((cl_context)local_340._0_8_ != (cl_context)(local_340 + 0x10)) {
          operator_delete((void *)local_340._0_8_);
        }
        snprintf((char *)local_138,0x100,"%u",(ulong)_Var1);
        std::__cxx11::string::append((char *)&local_380);
        std::__cxx11::string::append((char *)&local_380);
        snprintf((char *)local_138,0x100,"%04u",(ulong)uVar2);
        std::__cxx11::string::append((char *)&local_380);
        std::__cxx11::string::append((char *)&local_380);
        std::__cxx11::string::append((char *)&local_380);
        std::ifstream::ifstream(local_340);
        std::ifstream::open(local_340,(_Ios_Openmode)local_380._M_dataplus._M_p);
        if (*(int *)((long)aiStack_320 + *(long *)(local_340._0_8_ + -0x18)) == 0) {
          std::operator+(&local_360,"Injecting buffer file: ",&local_380);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_360);
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar21) {
            uVar22 = *(undefined4 *)paVar21;
            uVar23 = *(undefined4 *)((long)plVar12 + 0x14);
            local_468.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            local_468.field_2._8_4_ = (undefined4)plVar12[3];
            local_468.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
          }
          else {
            local_468.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            uVar22 = extraout_XMM0_Da;
            uVar23 = extraout_XMM0_Db;
            local_468._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_468._M_string_length = plVar12[1];
          *plVar12 = (long)paVar21;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          log(this,(double)CONCAT44(uVar23,uVar22));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
          std::istream::seekg((long)local_340,_S_beg);
          uVar13 = std::istream::tellg();
          std::istream::seekg((long)local_340,_S_beg);
          p_Var17 = (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          p_Var15 = local_428;
          if (p_Var17 != (_Base_ptr)0x0) {
            do {
              if (*(_Base_ptr *)(p_Var17 + 1) >= local_478) {
                p_Var15 = (_Rb_tree_header *)p_Var17;
              }
              p_Var17 = (&p_Var17->_M_left)[*(_Base_ptr *)(p_Var17 + 1) < local_478];
            } while (p_Var17 != (_Base_ptr)0x0);
            if ((p_Var15 != local_428) && ((_Base_ptr)p_Var15->_M_node_count <= local_478)) {
              pmVar14 = std::
                        map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                        ::operator[](local_3b8,&local_478);
              __new_size = *pmVar14;
              if (__new_size < uVar13) {
                logf(this,__x_00);
                goto LAB_001806ce;
              }
              p_Var17 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var15 = local_440;
              if (p_Var17 == (_Base_ptr)0x0) {
LAB_0018098f:
                local_468._M_dataplus._M_p = (pointer)0x0;
                pmVar16 = std::
                          map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                          ::at(local_3d8,(key_type *)&local_468);
              }
              else {
                do {
                  if (*(cl_platform_id *)(p_Var17 + 1) >= p_Var6) {
                    p_Var15 = (_Rb_tree_header *)p_Var17;
                  }
                  p_Var17 = (&p_Var17->_M_left)[*(cl_platform_id *)(p_Var17 + 1) < p_Var6];
                } while (p_Var17 != (_Base_ptr)0x0);
                if ((p_Var15 == local_440) || (p_Var6 < (cl_platform_id)p_Var15->_M_node_count))
                goto LAB_0018098f;
                pmVar16 = (mapped_type *)(p_Var15 + 1);
              }
              if (pmVar16->clEnqueueMemcpyINTEL ==
                  (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                   *)0x0) {
                local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_468,"clEnqueueMemcpyINTEL","");
                getExtensionFunctionAddress(this,p_Var6,&local_468);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_dataplus._M_p != &local_468.field_2) {
                  operator_delete(local_468._M_dataplus._M_p);
                }
              }
              if ((ulong)((long)local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start) < __new_size) {
                std::vector<char,_std::allocator<char>_>::resize(&local_3f8,__new_size);
              }
              p_Var17 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var15 = local_440;
              if (p_Var17 == (_Base_ptr)0x0) {
LAB_00180a5a:
                local_468._M_dataplus._M_p = (pointer)0x0;
                pmVar16 = std::
                          map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                          ::at(local_3d8,(key_type *)&local_468);
              }
              else {
                do {
                  if (*(cl_platform_id *)(p_Var17 + 1) >= p_Var6) {
                    p_Var15 = (_Rb_tree_header *)p_Var17;
                  }
                  p_Var17 = (&p_Var17->_M_left)[*(cl_platform_id *)(p_Var17 + 1) < p_Var6];
                } while (p_Var17 != (_Base_ptr)0x0);
                if ((p_Var15 == local_440) || (p_Var6 < (cl_platform_id)p_Var15->_M_node_count))
                goto LAB_00180a5a;
                pmVar16 = (mapped_type *)(p_Var15 + 1);
              }
              if ((pmVar16->clEnqueueMemcpyINTEL !=
                   (_func_cl_int_cl_command_queue_cl_bool_void_ptr_void_ptr_size_t_cl_uint_cl_event_ptr_cl_event_ptr
                    *)0x0) &&
                 (__new_size <=
                  (ulong)((long)local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start))) {
                std::istream::read(local_340,
                                   (long)local_3f8.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
                (*pmVar16->clEnqueueMemcpyINTEL)
                          (local_448,1,local_478,
                           local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,__new_size,0,(cl_event *)0x0,
                           (cl_event *)0x0);
              }
              goto LAB_001806ce;
            }
          }
          p_Var17 = (this->m_SVMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          p_Var15 = local_430;
          if (p_Var17 != (_Base_ptr)0x0) {
            do {
              if (*(_Base_ptr *)(p_Var17 + 1) >= local_478) {
                p_Var15 = (_Rb_tree_header *)p_Var17;
              }
              p_Var17 = (&p_Var17->_M_left)[*(_Base_ptr *)(p_Var17 + 1) < local_478];
            } while (p_Var17 != (_Base_ptr)0x0);
            if ((p_Var15 != local_430) && ((_Base_ptr)p_Var15->_M_node_count <= local_478)) {
              pmVar14 = std::
                        map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                        ::operator[](local_3c0,&local_478);
              if (*pmVar14 < uVar13) {
                logf(this,__x_01);
              }
              else {
                cVar5 = (*(this->m_Dispatch).clEnqueueSVMMap)
                                  (local_448,1,4,local_478,*pmVar14,0,(cl_event *)0x0,
                                   (cl_event *)0x0);
                if (cVar5 == 0) {
                  std::istream::read(local_340,(long)local_478);
                  (*(this->m_Dispatch).clEnqueueSVMUnmap)
                            (local_448,local_478,0,(cl_event *)0x0,(cl_event *)0x0);
                }
              }
              goto LAB_001806ce;
            }
          }
          p_Var17 = (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = local_438;
          if (p_Var17 != (_Base_ptr)0x0) {
            do {
              if (*(_Base_ptr *)(p_Var17 + 1) >= local_420) {
                p_Var15 = (_Rb_tree_header *)p_Var17;
              }
              p_Var17 = (&p_Var17->_M_left)[*(_Base_ptr *)(p_Var17 + 1) < local_420];
            } while (p_Var17 != (_Base_ptr)0x0);
            if ((p_Var15 != local_438) && ((_Base_ptr)p_Var15->_M_node_count <= local_420)) {
              pmVar14 = std::
                        map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                        ::operator[](local_3c8,(key_type *)&local_420);
              if (*pmVar14 < uVar13) {
                logf(this,__x);
              }
              else {
                local_468._M_dataplus._M_p = local_468._M_dataplus._M_p & 0xffffffff00000000;
                pvVar18 = (*(this->m_Dispatch).clEnqueueMapBuffer)
                                    (local_448,(cl_mem)local_420,1,4,0,*pmVar14,0,(cl_event *)0x0,
                                     (cl_event *)0x0,(cl_int *)&local_468);
                if ((int)local_468._M_dataplus._M_p == 0) {
                  std::istream::read(local_340,(long)pvVar18);
                  (*(this->m_Dispatch).clEnqueueUnmapMemObject)
                            (local_448,(cl_mem)local_420,pvVar18,0,(cl_event *)0x0,(cl_event *)0x0);
                }
              }
            }
          }
        }
LAB_001806ce:
        std::ifstream::~ifstream(local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
      }
    } while (p_Var8 != local_388);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
  __mutex = local_470;
  if (local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::injectBuffersForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(kernel);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        void*   allocation = (void*)(*i).second;
        cl_mem  memobj = (cl_mem)allocation;

        ++i;

        if( ( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() ) ||
            ( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() ) ||
            ( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() ) )
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the buffer number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Buffer_";
                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".bin";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting buffer file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                if( m_USMAllocInfoMap.find( allocation ) != m_USMAllocInfoMap.end() )
                {
                    size_t size = m_USMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: USM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        if( dispatchX(platform).clEnqueueMemcpyINTEL == NULL )
                        {
                            getExtensionFunctionAddress(
                                platform,
                                "clEnqueueMemcpyINTEL" );
                        }
                        if( transferBuf.size() < size )
                        {
                            transferBuf.resize(size);
                        }

                        const auto& dispatchX = this->dispatchX(platform);
                        if( dispatchX.clEnqueueMemcpyINTEL &&
                            transferBuf.size() >= size )
                        {
                            is.read( transferBuf.data(), size );

                            dispatchX.clEnqueueMemcpyINTEL(
                                command_queue,
                                CL_TRUE,
                                allocation,
                                transferBuf.data(),
                                size,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_SVMAllocInfoMap.find( allocation ) != m_SVMAllocInfoMap.end() )
                {
                    size_t size = m_SVMAllocInfoMap[ allocation ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: SVM alloc size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = dispatch().clEnqueueSVMMap(
                            command_queue,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            allocation,
                            size,
                            0,
                            NULL,
                            NULL );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)allocation, size );

                            dispatch().clEnqueueSVMUnmap(
                                command_queue,
                                allocation,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
                else if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
                {
                    size_t size = m_BufferInfoMap[ memobj ];
                    if( size < fileSize )
                    {
                        logf("Skipping injection: buffer size (%zu bytes) is less than file size (%zu bytes)!\n",
                            size, fileSize );
                    }
                    else
                    {
                        cl_int  error = CL_SUCCESS;
                        void*   ptr = dispatch().clEnqueueMapBuffer(
                            command_queue,
                            memobj,
                            CL_TRUE,
                            CL_MAP_WRITE_INVALIDATE_REGION,
                            0,
                            size,
                            0,
                            NULL,
                            NULL,
                            &error );
                        if( error == CL_SUCCESS )
                        {
                            is.read( (char*)ptr, size );

                            dispatch().clEnqueueUnmapMemObject(
                                command_queue,
                                memobj,
                                ptr,
                                0,
                                NULL,
                                NULL );
                        }
                    }
                }
            }
        }
    }
}